

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O0

optional<pizza_slice> * __thiscall
pizza_cutter::extend_slice
          (optional<pizza_slice> *__return_storage_ptr__,pizza_cutter *this,pizza_slice ps,
          direction dir)

{
  pizza_slice new_part;
  pizza_slice new_part_00;
  pizza_slice new_part_01;
  pizza_slice new_part_02;
  bool bVar1;
  undefined8 uVar2;
  pizza_cutter *ppVar3;
  pizza_slice local_a4;
  int local_94;
  int iStack_90;
  int local_8c;
  int iStack_88;
  pizza_slice local_84;
  int local_74;
  int iStack_70;
  int local_6c;
  int iStack_68;
  pizza_slice local_64;
  int local_54;
  int iStack_50;
  int local_4c;
  int iStack_48;
  pizza_slice local_44;
  int local_34;
  int iStack_30;
  int local_2c;
  int iStack_28;
  direction local_24;
  pizza_cutter *ppStack_20;
  direction dir_local;
  pizza_cutter *this_local;
  pizza_slice ps_local;
  
  uVar2 = ps._8_8_;
  ppVar3 = ps._0_8_;
  this_local._0_4_ = ps.row1;
  this_local._4_4_ = ps.col1;
  ps_local.row1 = ps.row2;
  ps_local.col1 = ps.col2;
  local_24 = dir;
  ppStack_20 = this;
  this_local = ppVar3;
  ps_local._0_8_ = uVar2;
  switch(dir) {
  case right:
    local_34 = (int)this_local;
    iStack_30 = ps_local.col1 + 1;
    local_2c = ps_local.row1;
    iStack_28 = ps_local.col1 + 1;
    new_part_02.col1 = iStack_30;
    new_part_02.row1 = (int)this_local;
    new_part_02.row2 = ps_local.row1;
    new_part_02.col2 = iStack_28;
    bVar1 = is_new_part_valid(this,new_part_02);
    ppVar3 = this_local;
    uVar2 = ps_local._0_8_;
    if (bVar1) {
      local_44.row1 = (int)this_local;
      local_44.col1 = this_local._4_4_;
      local_44.row2 = ps_local.row1;
      local_44.col2 = ps_local.col1 + 1;
      std::optional<pizza_slice>::optional<pizza_slice,_true>(__return_storage_ptr__,&local_44);
      return __return_storage_ptr__;
    }
    break;
  case down:
    local_54 = ps_local.row1 + 1;
    iStack_50 = this_local._4_4_;
    local_4c = ps_local.row1 + 1;
    iStack_48 = ps_local.col1;
    new_part_01.col1 = this_local._4_4_;
    new_part_01.row1 = local_54;
    new_part_01.row2 = local_4c;
    new_part_01.col2 = ps_local.col1;
    bVar1 = is_new_part_valid(this,new_part_01);
    ppVar3 = this_local;
    uVar2 = ps_local._0_8_;
    if (bVar1) {
      local_64.row1 = (int)this_local;
      local_64.col1 = this_local._4_4_;
      local_64.row2 = ps_local.row1 + 1;
      local_64.col2 = ps_local.col1;
      std::optional<pizza_slice>::optional<pizza_slice,_true>(__return_storage_ptr__,&local_64);
      return __return_storage_ptr__;
    }
    break;
  case left:
    local_74 = (int)this_local;
    iStack_70 = this_local._4_4_ + -1;
    local_6c = ps_local.row1;
    iStack_68 = this_local._4_4_ + -1;
    new_part_00.col1 = iStack_70;
    new_part_00.row1 = (int)this_local;
    new_part_00.row2 = ps_local.row1;
    new_part_00.col2 = iStack_68;
    bVar1 = is_new_part_valid(this,new_part_00);
    ppVar3 = this_local;
    uVar2 = ps_local._0_8_;
    if (bVar1) {
      local_84.row1 = (int)this_local;
      local_84.col1 = this_local._4_4_ + -1;
      local_84.row2 = ps_local.row1;
      local_84.col2 = ps_local.col1;
      std::optional<pizza_slice>::optional<pizza_slice,_true>(__return_storage_ptr__,&local_84);
      return __return_storage_ptr__;
    }
    break;
  case up:
    local_94 = (int)this_local + -1;
    iStack_90 = this_local._4_4_;
    local_8c = (int)this_local + -1;
    iStack_88 = ps_local.col1;
    new_part.col1 = this_local._4_4_;
    new_part.row1 = local_94;
    new_part.row2 = local_8c;
    new_part.col2 = ps_local.col1;
    bVar1 = is_new_part_valid(this,new_part);
    ppVar3 = this_local;
    uVar2 = ps_local._0_8_;
    if (bVar1) {
      local_a4.row1 = (int)this_local + -1;
      local_a4.col1 = this_local._4_4_;
      local_a4.row2 = ps_local.row1;
      local_a4.col2 = ps_local.col1;
      std::optional<pizza_slice>::optional<pizza_slice,_true>(__return_storage_ptr__,&local_a4);
      return __return_storage_ptr__;
    }
  }
  ps_local._0_8_ = uVar2;
  this_local = ppVar3;
  std::optional<pizza_slice>::optional(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::optional<pizza_slice> pizza_cutter::extend_slice(pizza_slice ps, direction dir) const noexcept
{
    switch(dir) {
        case direction::right:
            if (is_new_part_valid(pizza_slice{ps.row1, ps.col2 + 1, ps.row2, ps.col2 + 1}))
                return pizza_slice{ps.row1, ps.col1, ps.row2, ps.col2 + 1};
            break;
        case direction::down:
            if (is_new_part_valid(pizza_slice{ps.row2 + 1, ps.col1, ps.row2 + 1, ps.col2}))
                return pizza_slice{ps.row1, ps.col1, ps.row2 + 1, ps.col2};
            break;
        case direction::left:
            if (is_new_part_valid(pizza_slice{ps.row1, ps.col1 - 1, ps.row2, ps.col1 - 1}))
                return pizza_slice{ps.row1, ps.col1 - 1, ps.row2, ps.col2};
            break;
        case direction::up:
            if (is_new_part_valid(pizza_slice{ps.row1 - 1, ps.col1, ps.row1 - 1, ps.col2}))
                return pizza_slice{ps.row1 - 1, ps.col1, ps.row2, ps.col2};
            break;
    }
    return std::nullopt;
}